

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  Curl_easy *pCVar4;
  Curl_hash *sh;
  uint uVar5;
  int iVar6;
  Curl_sh_entry *pCVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  bool bVar16;
  Curl_easy *data_local;
  Curl_hash *local_68;
  uint local_60;
  int local_5c;
  uchar actions [5];
  curl_socket_t socks [5];
  
  for (lVar10 = 0; lVar10 != 5; lVar10 = lVar10 + 1) {
    socks[lVar10] = -1;
  }
  data_local = data;
  uVar5 = multi_getsock(data,socks);
  local_68 = &multi->sockhash;
  for (lVar10 = 0; sh = local_68, lVar10 != 5; lVar10 = lVar10 + 1) {
    uVar14 = (uint)lVar10;
    if ((uVar5 >> ((byte)lVar10 & 0x1f) & 0x10001) == 0) goto LAB_0012f37b;
    uVar13 = 0x10000 << ((byte)lVar10 & 0x1f);
    iVar3 = socks[lVar10];
    pCVar7 = sh_getentry(local_68,iVar3);
    bVar16 = (uVar5 >> (uVar14 & 0x1f) & 1) != 0;
    bVar15 = bVar16 + 2;
    if ((uVar13 & uVar5) == 0) {
      bVar15 = bVar16;
    }
    actions[lVar10] = bVar15;
    if (pCVar7 == (Curl_sh_entry *)0x0) {
      local_5c = iVar3;
      pCVar7 = sh_getentry(sh,iVar3);
      if (pCVar7 == (Curl_sh_entry *)0x0) {
        pCVar7 = (Curl_sh_entry *)(*Curl_ccalloc)(1,0x48);
        if (pCVar7 == (Curl_sh_entry *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        iVar6 = Curl_hash_init((Curl_hash *)pCVar7,0xd,trhash,trhash_compare,trhash_dtor);
        if (iVar6 != 0) {
LAB_0012f48c:
          (*Curl_cfree)(pCVar7);
          return CURLM_OUT_OF_MEMORY;
        }
        pvVar8 = Curl_hash_add(local_68,&local_5c,4,pCVar7);
        if (pvVar8 == (void *)0x0) {
          Curl_hash_destroy((Curl_hash *)pCVar7);
          goto LAB_0012f48c;
        }
      }
LAB_0012f2e9:
      pCVar7->users = pCVar7->users + 1;
      if ((bVar15 & 1) != 0) {
        pCVar7->readers = pCVar7->readers + 1;
      }
      if ((uVar13 & uVar5) != 0) {
        pCVar7->writers = pCVar7->writers + 1;
      }
      pvVar8 = Curl_hash_add(&pCVar7->transfers,&data_local,8,data_local);
      if (pvVar8 == (void *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
      bVar16 = false;
    }
    else {
      uVar11 = (ulong)(uint)data_local->numsocks;
      if (data_local->numsocks < 1) {
        uVar11 = 0;
      }
      uVar9 = 0;
      do {
        uVar12 = uVar9;
        if (uVar11 == uVar12) goto LAB_0012f2e9;
        uVar9 = uVar12 + 1;
      } while (iVar3 != data_local->sockets[uVar12]);
      bVar2 = data_local->actions[uVar12];
      bVar16 = true;
      if (bVar2 != bVar15) {
        if ((bVar2 & 1) != 0) {
          pCVar7->readers = pCVar7->readers - 1;
        }
        if ((bVar2 & 2) != 0) {
          pCVar7->writers = pCVar7->writers - 1;
        }
        if ((bVar15 & 1) != 0) {
          pCVar7->readers = pCVar7->readers + 1;
        }
        if ((uVar13 & uVar5) != 0) {
          pCVar7->writers = pCVar7->writers + 1;
        }
      }
    }
    uVar14 = (uint)(pCVar7->readers != 0) + (uint)(pCVar7->writers != 0) * 2;
    if ((!bVar16) || (pCVar7->action != uVar14)) {
      if (multi->socket_cb != (curl_socket_callback)0x0) {
        (*multi->socket_cb)(data_local,iVar3,uVar14,multi->socket_userp,pCVar7->socketp);
      }
      pCVar7->action = uVar14;
    }
  }
  uVar14 = 5;
LAB_0012f37b:
  uVar11 = (ulong)uVar14;
  lVar10 = 0;
  local_60 = uVar14;
  do {
    pCVar4 = data_local;
    if (data_local->numsocks <= lVar10) {
      memcpy(data_local->sockets,socks,uVar11 * 4);
      memcpy(pCVar4->actions,actions,uVar11);
      pCVar4->numsocks = local_60;
      return CURLM_OK;
    }
    iVar3 = data_local->sockets[lVar10];
    uVar9 = 0;
    do {
      if (uVar11 == uVar9) {
        pCVar7 = sh_getentry(local_68,iVar3);
        if (pCVar7 != (Curl_sh_entry *)0x0) {
          bVar15 = data_local->actions[lVar10];
          uVar5 = pCVar7->users - 1;
          pCVar7->users = uVar5;
          if ((bVar15 & 2) != 0) {
            pCVar7->writers = pCVar7->writers - 1;
          }
          if ((bVar15 & 1) != 0) {
            pCVar7->readers = pCVar7->readers - 1;
          }
          if (uVar5 == 0) {
            if (multi->socket_cb != (curl_socket_callback)0x0) {
              (*multi->socket_cb)(data_local,iVar3,4,multi->socket_userp,pCVar7->socketp);
            }
            sh_delentry(pCVar7,local_68,iVar3);
          }
          else {
            Curl_hash_delete(&pCVar7->transfers,&data_local,8);
          }
        }
        break;
      }
      piVar1 = socks + uVar9;
      uVar9 = uVar9 + 1;
    } while (iVar3 != *piVar1);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  unsigned char actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned char action = CURL_POLL_NONE;
    unsigned char prevaction = 0;
    int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      int j;
      for(j = 0; j< data->numsocks; j++) {
        if(s == data->sockets[j]) {
          prevaction = data->actions[j];
          sincebefore = TRUE;
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data))
        return CURLM_OUT_OF_MEMORY;
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(sincebefore && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb)
      multi->socket_cb(data, s, comboaction, multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(char));
  data->numsocks = num;
  return CURLM_OK;
}